

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-entry-combiner.c
# Opt level: O2

void resist_0_combine_finish(ui_entry_combiner_state *st)

{
  int *p;
  
  p = (int *)st->work;
  if ((*p < 0) && (st->accum < 3)) {
    st->accum = -(uint)(st->accum == 0) | 0x7ffffffd;
  }
  if ((p[1] < 0) && (st->accum_aux < 3)) {
    st->accum_aux = -(uint)(st->accum_aux == 0) | 0x7ffffffd;
  }
  mem_free(p);
  st->work = (void *)0x0;
  return;
}

Assistant:

static void resist_0_combine_finish(struct ui_entry_combiner_state *st)
{
	int *work = st->work;

	if (work[0] < 0 && work[0] != UI_ENTRY_UNKNOWN_VALUE
			&& work[0] != UI_ENTRY_VALUE_NOT_PRESENT) {
		/* A vulnerability cancels a resist but not an immunity. */
		if (st->accum < 3 && st->accum != UI_ENTRY_UNKNOWN_VALUE
				&& st->accum != UI_ENTRY_VALUE_NOT_PRESENT) {
			if (st->accum == 0) {
				st->accum = -1;
			} else {
				st->accum = UI_ENTRY_RESIST0_RES_VUL;
			}
		}
	}
	if (work[1] < 0 && work[1] != UI_ENTRY_UNKNOWN_VALUE
			&& work[1] != UI_ENTRY_VALUE_NOT_PRESENT) {
		if (st->accum_aux < 3
				&& st->accum_aux != UI_ENTRY_UNKNOWN_VALUE
				&& st->accum_aux != UI_ENTRY_VALUE_NOT_PRESENT) {
			if (st->accum_aux == 0) {
				st->accum_aux = -1;
			} else {
				st->accum_aux = UI_ENTRY_RESIST0_RES_VUL;
			}
		}
	}
	mem_free(work);
	st->work = 0;
}